

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O0

void __thiscall HModel::initCost(HModel *this,int perturb)

{
  double dVar1;
  double dVar2;
  reference pvVar3;
  double *pdVar4;
  int in_ESI;
  long in_RDI;
  double dVar5;
  double dVar6;
  int i_3;
  double xpert;
  double upper;
  double lower;
  int i_2;
  double base;
  int i_1;
  double boxedRate;
  int i;
  double bigc;
  undefined8 in_stack_ffffffffffffff68;
  HModel *in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff78;
  HModel *in_stack_ffffffffffffff80;
  int local_6c;
  int local_4c;
  double local_40;
  int local_34;
  double local_30;
  value_type local_28;
  int local_1c;
  double local_18;
  int local_c;
  
  local_c = in_ESI;
  initPh2ColCost(in_stack_ffffffffffffff80,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                 (int)in_stack_ffffffffffffff78);
  initPh2RowCost(in_stack_ffffffffffffff70,(int)((ulong)in_stack_ffffffffffffff68 >> 0x20),
                 (int)in_stack_ffffffffffffff68);
  *(undefined4 *)(in_RDI + 0x570) = 0;
  if ((local_c != 0) && (*(int *)(in_RDI + 0x14) != 0)) {
    *(undefined4 *)(in_RDI + 0x570) = 1;
    local_18 = 0.0;
    for (local_1c = 0; local_1c < *(int *)(in_RDI + 0x60c); local_1c = local_1c + 1) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x798),(long)local_1c
                         );
      local_28 = ABS(*pvVar3);
      pdVar4 = std::max<double>(&local_18,&local_28);
      local_18 = *pdVar4;
    }
    if (100.0 < local_18) {
      dVar5 = sqrt(local_18);
      local_18 = sqrt(dVar5);
    }
    local_30 = 0.0;
    for (local_34 = 0; local_34 < *(int *)(in_RDI + 0x614); local_34 = local_34 + 1) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x810),(long)local_34
                         );
      local_30 = (double)(*pvVar3 <= 1e+30 && *pvVar3 != 1e+30) + local_30;
    }
    local_30 = local_30 / (double)*(int *)(in_RDI + 0x614);
    if (local_30 < 0.01) {
      local_40 = 1.0;
      pdVar4 = std::min<double>(&local_18,&local_40);
      local_18 = *pdVar4;
    }
    dVar5 = local_18 * 5e-07;
    for (local_4c = 0; local_4c < *(int *)(in_RDI + 0x60c); local_4c = local_4c + 1) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x6a8),(long)local_4c
                         );
      dVar1 = *pvVar3;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x6c0),(long)local_4c
                         );
      dVar2 = *pvVar3;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x798),(long)local_4c
                         );
      dVar6 = (ABS(*pvVar3) + 1.0) * dVar5;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x8b8),(long)local_4c
                         );
      dVar6 = dVar6 * (*pvVar3 + 1.0);
      if ((((dVar1 != -1e+200) || (NAN(dVar1))) || (dVar2 != 1e+200)) || (NAN(dVar2))) {
        if ((dVar2 != 1e+200) || (NAN(dVar2))) {
          if ((dVar1 != -1e+200) || (NAN(dVar1))) {
            if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
              pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                                 ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x798),
                                  (long)local_4c);
              if (*pvVar3 < 0.0) {
                dVar6 = -dVar6;
              }
              pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                                 ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x798),
                                  (long)local_4c);
              *pvVar3 = dVar6 + *pvVar3;
            }
          }
          else {
            dVar6 = -dVar6;
            pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x798),
                                (long)local_4c);
            *pvVar3 = dVar6 + *pvVar3;
          }
        }
        else {
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x798),
                              (long)local_4c);
          *pvVar3 = dVar6 + *pvVar3;
        }
      }
    }
    for (local_6c = *(int *)(in_RDI + 0x60c); local_6c < *(int *)(in_RDI + 0x614);
        local_6c = local_6c + 1) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x8b8),(long)local_6c
                         );
      dVar5 = *pvVar3;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x798),(long)local_6c
                         );
      *pvVar3 = (0.5 - dVar5) * 1e-12 + *pvVar3;
    }
  }
  return;
}

Assistant:

void HModel::initCost(int perturb) {
  // Copy the cost
  initPh2ColCost(0, numCol-1);
  initPh2RowCost(0, numRow-1);
  // See if we want to skip perturbation
  problemPerturbed = 0;
  if (perturb == 0 || intOption[INTOPT_PERTURB_FLAG] == 0) return;
  problemPerturbed = 1;

  // Perturb the original costs, scale down if is too big
  double bigc = 0;
  for (int i = 0; i < numCol; i++)
    bigc = max(bigc, fabs(workCost[i]));
  if (bigc > 100)
    bigc = sqrt(sqrt(bigc));
  
  // If there's few boxed variables, we will just use Simple perturbation
  double boxedRate = 0;
  for (int i = 0; i < numTot; i++)
    boxedRate += (workRange[i] < 1e30);
  boxedRate /= numTot;
  if (boxedRate < 0.01)
    bigc = min(bigc, 1.0);
  if (bigc < 1) {
    //        bigc = sqrt(bigc);
  }
  
  // Determine the perturbation base
  double base = 5e-7 * bigc;
  
  // Now do the perturbation
  for (int i = 0; i < numCol; i++) {
    double lower = colLower[i];
    double upper = colUpper[i];
    double xpert = (fabs(workCost[i]) + 1) * base * (1 + dblXpert[i]);
    if (lower == -HSOL_CONST_INF && upper == HSOL_CONST_INF) {
      // Free - no perturb
    } else if (upper == HSOL_CONST_INF) {  // Lower
      workCost[i] += xpert;
    } else if (lower == -HSOL_CONST_INF) { // Upper
      workCost[i] += -xpert;
    } else if (lower != upper) {  // Boxed
      workCost[i] += (workCost[i] >= 0) ? xpert : -xpert;
    } else {
      // Fixed - no perturb
    }
  }
  
  for (int i = numCol; i < numTot; i++) {
    workCost[i] += (0.5 - dblXpert[i]) * 1e-12;
  }
  
}